

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::handleAfterEffects(PassRunner *this,Pass *pass,Function *func)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  reference this_01;
  pointer func_00;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Function *func_local;
  Pass *pass_local;
  PassRunner *this_local;
  
  uVar2 = (*pass->_vptr_Pass[6])();
  if ((uVar2 & 1) != 0) {
    if (func == (Function *)0x0) {
      iVar3 = (*pass->_vptr_Pass[4])();
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
        __assert_fail("!pass->isFunctionParallel()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                      ,0x411,"void wasm::PassRunner::handleAfterEffects(Pass *, Function *)");
      }
      this_00 = &this->wasm->functions;
      __end2 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::begin(this_00);
      func_1 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                         *)&func_1), bVar1) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end2);
        func_00 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                            (this_01);
        handleAfterEffects(this,pass,func_00);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    else {
      std::
      unique_ptr<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
      ::reset(&func->stackIR,(pointer)0x0);
      uVar2 = (*pass->_vptr_Pass[8])();
      if ((uVar2 & 1) != 0) {
        TypeUpdating::handleNonDefaultableLocals(func,this->wasm);
      }
    }
  }
  return;
}

Assistant:

void PassRunner::handleAfterEffects(Pass* pass, Function* func) {
  if (!pass->modifiesBinaryenIR()) {
    return;
  }

  // Binaryen IR is modified, so we may have work here.

  if (!func) {
    // If no function is provided, then this is not a function-parallel pass,
    // and it may have operated on any of the functions in theory, so run on
    // them all.
    assert(!pass->isFunctionParallel());
    for (auto& func : wasm->functions) {
      handleAfterEffects(pass, func.get());
    }
    return;
  }

  // If Binaryen IR is modified, Stack IR must be cleared - it would
  // be out of sync in a potentially dangerous way.
  func->stackIR.reset(nullptr);

  if (pass->requiresNonNullableLocalFixups()) {
    TypeUpdating::handleNonDefaultableLocals(func, *wasm);
  }
}